

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O0

void CheckEqualsHelper(char *file,int line,char *expected_source,double expected,char *value_source,
                      double value)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  if (((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) &&
     ((!NAN(in_XMM0_Qa) || (!NAN(in_XMM1_Qa))))) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",in_XMM0_Qa,
           in_XMM1_Qa,in_RDI,(ulong)in_ESI,in_RDX,in_RCX);
    abort();
  }
  return;
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     double expected,
                                     const char* value_source,
                                     double value) {
  // If expected and value are NaNs then expected != value.
  if (expected != value && (expected == expected || value == value)) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %.30e\n"
           "#  Found:    %.30e\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}